

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.cxx
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  option *poVar4;
  option *poVar5;
  option *poVar6;
  option *poVar7;
  option *poVar8;
  option *poVar9;
  option *poVar10;
  undefined *puVar11;
  clock_t cVar12;
  clock_t cVar13;
  uint uVar14;
  uint uVar15;
  level_tools *this;
  long lVar17;
  cl_parser cl;
  char *fs_spec;
  cl_parser local_88;
  option *local_68;
  string local_60;
  option *local_40;
  option *local_38;
  level_tools *plVar16;
  
  cl_parser::cl_parser(&local_88);
  bVar1 = cl_parser::parse(&local_88,argc,argv,0x25,main::options);
  if (!bVar1) {
    usage();
    iVar3 = 1;
    goto LAB_0011f963;
  }
  local_68 = cl_parser::find_option(&local_88,"-ogf");
  local_38 = cl_parser::find_option(&local_88,"-omf");
  local_40 = cl_parser::find_option(&local_88,"-dm");
  poVar4 = cl_parser::find_option(&local_88,"-level");
  poVar5 = cl_parser::find_option(&local_88,"-ogg2wav");
  poVar6 = cl_parser::find_option(&local_88,"-dds2tga");
  poVar7 = cl_parser::find_option(&local_88,"-unpack");
  poVar8 = cl_parser::find_option(&local_88,"-pack");
  poVar9 = cl_parser::find_option(&local_88,"-fancy");
  poVar10 = cl_parser::find_option(&local_88,"-xrdemo");
  uVar15 = (local_68 != (option *)0x0) + 2;
  if (local_38 == (option *)0x0) {
    uVar15 = (uint)(local_68 != (option *)0x0);
  }
  uVar14 = uVar15 + 4;
  if (local_40 == (option *)0x0) {
    uVar14 = uVar15;
  }
  uVar15 = uVar14 + 8;
  if (poVar4 == (option *)0x0) {
    uVar15 = uVar14;
  }
  uVar14 = uVar15 | 0x10;
  if (poVar5 == (option *)0x0) {
    uVar14 = uVar15;
  }
  uVar15 = uVar14 | 0x20;
  if (poVar6 == (option *)0x0) {
    uVar15 = uVar14;
  }
  uVar14 = uVar15 | 0x40;
  if (poVar7 == (option *)0x0) {
    uVar14 = uVar15;
  }
  uVar15 = uVar14 | 0x80;
  if (poVar8 == (option *)0x0) {
    uVar15 = uVar14;
  }
  uVar14 = uVar15 | 0x100;
  if (poVar9 == (option *)0x0) {
    uVar14 = uVar15;
  }
  uVar15 = uVar14 | 0x200;
  if (poVar10 == (option *)0x0) {
    uVar15 = uVar14;
  }
  if (uVar15 == 0) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    iVar3 = 0;
    uVar15 = 0;
    local_68 = (option *)local_88.m_num_params;
    if ((option *)local_88.m_num_params != (option *)0x0) {
      uVar15 = 0;
      lVar17 = -0x18;
      poVar4 = (option *)local_88.m_num_params;
      do {
        bVar1 = xray_re::xr_file_system::folder_exist
                          (*(char **)((long)&local_88.m_options[local_88.m_argc].name + lVar17));
        if (bVar1) {
          uVar15 = uVar15 | 0x80;
        }
        else {
          xray_re::xr_file_system::split_path
                    (*(char **)((long)&local_88.m_options[local_88.m_argc].name + lVar17),
                     (string *)0x0,(string *)0x0,&local_60);
          iVar2 = std::__cxx11::string::compare((char *)&local_60);
          if (iVar2 == 0) {
            uVar15 = uVar15 | 1;
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)&local_60);
            if (iVar2 == 0) {
              uVar15 = uVar15 | 2;
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)&local_60);
              if (iVar2 == 0) {
                uVar15 = uVar15 | 4;
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)&local_60);
                if (iVar2 == 0) {
                  uVar15 = uVar15 | 0x200;
                }
                else {
                  bVar1 = db_tools::is_known(&local_60);
                  if (bVar1) {
                    uVar15 = uVar15 | 0x40;
                  }
                }
              }
            }
          }
        }
        lVar17 = lVar17 + -0x18;
        poVar4 = (option *)((long)&poVar4[-1].field_2 + 7);
      } while (poVar4 != (option *)0x0);
    }
    if (uVar15 == 0) {
      if (local_68 == (option *)0x0) {
        usage();
        iVar3 = 1;
      }
      else {
        iVar3 = 1;
        xray_re::msg("can\'t auto-detect the source format");
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,
                      CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                               local_60.field_2._M_local_buf[0]) + 1);
    }
    if (uVar15 == 0) goto LAB_0011f963;
  }
  if ((uVar15 & uVar15 - 1) != 0) {
    iVar3 = 1;
    xray_re::msg("conflicting source formats");
    goto LAB_0011f963;
  }
  local_60._M_dataplus._M_p = (pointer)0x0;
  if (((uVar15 < 0x21) && ((0x100010100U >> ((ulong)uVar15 & 0x3f) & 1) != 0)) || (uVar15 == 0x100))
  {
    bVar1 = cl_parser::get_string(&local_88,"-fs",(char **)&local_60);
    if (!bVar1) {
      local_60._M_dataplus._M_p = "fsconverter.ltx";
    }
    bVar1 = xray_re::xr_file_system::file_exist(local_60._M_dataplus._M_p);
    if (!bVar1) {
      iVar3 = 1;
      xray_re::msg("can\'t find %s",local_60._M_dataplus._M_p);
      goto LAB_0011f963;
    }
  }
  bVar1 = cl_parser::get_bool(&local_88,"-ro");
  if (bVar1) {
    xray_re::msg("working in read-only mode");
  }
  if ((xray_re::xr_file_system::instance()::instance0 == '\0') &&
     (iVar3 = __cxa_guard_acquire(&xray_re::xr_file_system::instance()::instance0), iVar3 != 0)) {
    xray_re::xr_file_system::xr_file_system(&xray_re::xr_file_system::instance::instance0);
    __cxa_atexit(xray_re::xr_file_system::~xr_file_system,
                 &xray_re::xr_file_system::instance::instance0,&__dso_handle);
    __cxa_guard_release(&xray_re::xr_file_system::instance()::instance0);
  }
  bVar1 = xray_re::xr_file_system::initialize
                    (&xray_re::xr_file_system::instance::instance0,local_60._M_dataplus._M_p,
                     (uint)bVar1);
  if (!bVar1) {
    iVar3 = 1;
    xray_re::msg("can\'t initialize the file system");
    goto LAB_0011f963;
  }
  if (xray_re::xr_log::instance()::instance0 == '\0') {
    main_cold_1();
  }
  xray_re::xr_log::init
            ((xr_log *)xray_re::xr_log::instance()::instance0,(EVP_PKEY_CTX *)"converter");
  plVar16 = (level_tools *)0x0;
  this = (level_tools *)0x0;
  if (0x1f < uVar15) {
    if (uVar15 < 0x80) {
      if (uVar15 == 0x20) {
        this = (level_tools *)operator_new(0x30);
        dds_tools::dds_tools((dds_tools *)this);
      }
      else if (uVar15 == 0x40) {
        this = (level_tools *)operator_new(8);
        (this->super_tools_base)._vptr_tools_base = (_func_int **)&PTR__tools_base_00244f68;
      }
    }
    else if (uVar15 == 0x80) {
      this = (level_tools *)operator_new(0x60);
      (this->super_tools_base)._vptr_tools_base = (_func_int **)&PTR__db_packer_00244f28;
      *(char ***)&this->m_rmode = &this->m_sect_profile;
      this->m_ini = (xr_ini_file *)0x0;
      *(undefined1 *)&this->m_sect_profile = 0;
      this->m_sect_wallmark_shaders = (char *)0x0;
      this->m_debug_texture = (char *)0x0;
      this->m_fake_gamemtl = (char *)0x0;
      this->m_ladders_gamemtl = (char *)0x0;
      this->m_ghost_eshader = (char *)0x0;
      this->m_shaders_xrlc_lib = (xr_shaders_xrlc_lib *)0x0;
    }
    else if (uVar15 == 0x100) {
      this = (level_tools *)operator_new(0x10);
      (this->super_tools_base)._vptr_tools_base = (_func_int **)&PTR__fancy_tools_00245060;
      (this->super_xr_surface_factory)._vptr_xr_surface_factory = (_func_int **)0x0;
    }
    else {
      this = plVar16;
      if (uVar15 == 0x200) {
        this = (level_tools *)operator_new(0x50);
        *(char ***)&this->m_rmode = &this->m_sect_profile;
        this->m_ini = (xr_ini_file *)0x0;
        *(undefined1 *)&this->m_sect_profile = 0;
        this->m_sect_wallmark_shaders = (char *)&this->m_fake_gamemtl;
        this->m_debug_texture = (char *)0x0;
        *(undefined1 *)&this->m_fake_gamemtl = 0;
        puVar11 = &xrdemo_tools::vtable;
        goto LAB_0011f858;
      }
    }
    goto switchD_0011f686_caseD_2;
  }
  this = plVar16;
  switch(uVar15 - 1) {
  case 0:
    this = (level_tools *)operator_new(0x50);
    *(char ***)&this->m_rmode = &this->m_sect_profile;
    this->m_ini = (xr_ini_file *)0x0;
    *(undefined1 *)&this->m_sect_profile = 0;
    this->m_sect_wallmark_shaders = (char *)&this->m_fake_gamemtl;
    this->m_debug_texture = (char *)0x0;
    *(undefined1 *)&this->m_fake_gamemtl = 0;
    puVar11 = &ogf_tools::vtable;
    goto LAB_0011f858;
  case 1:
    this = (level_tools *)operator_new(0x50);
    *(char ***)&this->m_rmode = &this->m_sect_profile;
    this->m_ini = (xr_ini_file *)0x0;
    *(undefined1 *)&this->m_sect_profile = 0;
    this->m_sect_wallmark_shaders = (char *)&this->m_fake_gamemtl;
    this->m_debug_texture = (char *)0x0;
    *(undefined1 *)&this->m_fake_gamemtl = 0;
    puVar11 = &omf_tools::vtable;
    goto LAB_0011f858;
  case 2:
  case 4:
  case 5:
  case 6:
    break;
  case 3:
    this = (level_tools *)operator_new(0x50);
    *(char ***)&this->m_rmode = &this->m_sect_profile;
    this->m_ini = (xr_ini_file *)0x0;
    *(undefined1 *)&this->m_sect_profile = 0;
    this->m_sect_wallmark_shaders = (char *)&this->m_fake_gamemtl;
    this->m_debug_texture = (char *)0x0;
    *(undefined1 *)&this->m_fake_gamemtl = 0;
    puVar11 = &dm_tools::vtable;
LAB_0011f858:
    (this->super_tools_base)._vptr_tools_base = (_func_int **)(puVar11 + 0x10);
    (this->super_xr_surface_factory)._vptr_xr_surface_factory = (_func_int **)(puVar11 + 0x38);
    break;
  case 7:
    this = (level_tools *)operator_new(0x140);
    level_tools::level_tools(this);
    break;
  default:
    if (uVar15 == 0x10) {
      this = (level_tools *)operator_new(0x28);
      (this->super_tools_base)._vptr_tools_base = (_func_int **)&PTR__ogg_tools_00245660;
      (this->super_xr_surface_factory)._vptr_xr_surface_factory = (_func_int **)&this->m_ini;
      this->m_rmode = 0;
      this->m_rflags = 0;
      *(undefined1 *)&this->m_ini = 0;
    }
  }
switchD_0011f686_caseD_2:
  if (this == (level_tools *)0x0) {
    iVar3 = 0;
    xray_re::msg("locked");
  }
  else {
    cVar12 = clock();
    (*(this->super_tools_base)._vptr_tools_base[2])(this,&local_88);
    cVar13 = clock();
    xray_re::msg("total time: %.3lfs",SUB84((double)(cVar13 - cVar12) / 1000000.0,0));
    (*(this->super_tools_base)._vptr_tools_base[1])(this);
    iVar3 = 0;
  }
LAB_0011f963:
  cl_parser::~cl_parser(&local_88);
  return iVar3;
}

Assistant:

int main(int argc, char* argv[])
{
	static const cl_parser::option_desc options[] = {
		{"-ogf",	cl_parser::OT_BOOL},
		{"-omf",	cl_parser::OT_BOOL},
		{"-dm",		cl_parser::OT_BOOL},
		{"-level",	cl_parser::OT_BOOL},
		{"-ogg2wav",	cl_parser::OT_BOOL},
		{"-dds2tga",	cl_parser::OT_BOOL},
		{"-unpack",	cl_parser::OT_BOOL},
		{"-pack",	cl_parser::OT_BOOL},
		{"-xrdemo",	cl_parser::OT_BOOL},

		{"-11xx",	cl_parser::OT_BOOL},
		{"-2215",	cl_parser::OT_BOOL},
		{"-2945",	cl_parser::OT_BOOL},
		{"-2947ru",	cl_parser::OT_BOOL},
		{"-2947ww",	cl_parser::OT_BOOL},
		{"-xdb",	cl_parser::OT_BOOL},
		{"-xdb_ud",	cl_parser::OT_STRING},

		{"-info",	cl_parser::OT_BOOL},
		{"-skl",	cl_parser::OT_STRING},
		{"-skls",	cl_parser::OT_BOOL},
		{"-bones",	cl_parser::OT_BOOL},
		{"-comment",	cl_parser::OT_BOOL},
		{"-object",	cl_parser::OT_BOOL},
		{"-sg",		cl_parser::OT_STRING},

		{"-fs",		cl_parser::OT_STRING},
		{"-out",	cl_parser::OT_STRING},
		{"-dir",	cl_parser::OT_STRING},
		{"-flt",	cl_parser::OT_STRING},

		{"-ro",		cl_parser::OT_BOOL},

		{"-with_solid",	cl_parser::OT_BOOL},
		{"-with_bump",	cl_parser::OT_BOOL},

		{"-mode",	cl_parser::OT_STRING},
		{"-with_lods",	cl_parser::OT_BOOL},
		{"-dbgcfrm",	cl_parser::OT_BOOL},
		{"-dbgmrg",	cl_parser::OT_BOOL},
		{"-use_mt",	cl_parser::OT_BOOL},
		{"-terrain", cl_parser::OT_BOOL},

		{"-fancy",	cl_parser::OT_STRING},
	};

	cl_parser cl;
	if (!cl.parse(argc, argv, xr_dim(options), options)) {
		usage();
		return 1;
	}

	unsigned format = tools_base::TOOLS_AUTO;
	if (cl.exist("-ogf"))
		format |= tools_base::TOOLS_OGF;
	if (cl.exist("-omf"))
		format |= tools_base::TOOLS_OMF;
	if (cl.exist("-dm"))
		format |= tools_base::TOOLS_DM;
	if (cl.exist("-level"))
		format |= tools_base::TOOLS_LEVEL;
	if (cl.exist("-ogg2wav"))
		format |= tools_base::TOOLS_OGG;
	if (cl.exist("-dds2tga"))
		format |= tools_base::TOOLS_DDS;
	if (cl.exist("-unpack"))
		format |= tools_base::TOOLS_DB;
	if (cl.exist("-pack"))
		format |= tools_base::TOOLS_FOLDER;
	if (cl.exist("-fancy"))
		format |= tools_base::TOOLS_FANCY;
	if (cl.exist("-xrdemo"))
		format |= tools_base::TOOLS_XRDEMO;
	if (format == tools_base::TOOLS_AUTO) {
		std::string extension;
		size_t num_params = cl.num_params();
		for (size_t i = 0; i != num_params; ++i) {
			if (xr_file_system::folder_exist(cl.param(i))) {
				format |= tools_base::TOOLS_FOLDER;
			} else {
				xr_file_system::split_path(cl.param(i), 0, 0, &extension);
				if (extension == ".ogf")
					format |= tools_base::TOOLS_OGF;
				else if (extension == ".omf")
					format |= tools_base::TOOLS_OMF;
				else if (extension == ".dm")
					format |= tools_base::TOOLS_DM;
				else if (extension == ".xrdemo")
					format |= tools_base::TOOLS_XRDEMO;
				else if (db_tools::is_known(extension))
					format |= tools_base::TOOLS_DB;
			}
		}
		if (format == tools_base::TOOLS_AUTO) {
			if (num_params)
				msg("can't auto-detect the source format");
			else
				usage();
			return 1;
		}
	}
	if ((format & (format - 1)) != 0) {
		msg("conflicting source formats");
		return 1;
	}

	const char* fs_spec = 0;
	if (format == tools_base::TOOLS_LEVEL ||
			format == tools_base::TOOLS_DDS ||
			format == tools_base::TOOLS_FANCY ||
			format == tools_base::TOOLS_OGG) {
		if (!cl.get_string("-fs", fs_spec))
			fs_spec = DEFAULT_FS_SPEC;
		if (!xr_file_system::file_exist(fs_spec)) {
			msg("can't find %s", fs_spec);
			return 1;
		}
	}
	unsigned fs_flags = 0;
	if (cl.get_bool("-ro")) {
		fs_flags |= xr_file_system::FSF_READ_ONLY;
		msg("working in read-only mode");
	}
	xr_file_system& fs = xr_file_system::instance();
	if (!fs.initialize(fs_spec, fs_flags)) {
		msg("can't initialize the file system");
		return 1;
	}
	xr_log::instance().init("converter", 0);

	tools_base* tools = 0;
	switch (format) {
	case tools_base::TOOLS_OGF:
		tools = new ogf_tools;
		break;
	case tools_base::TOOLS_OMF:
		tools = new omf_tools;
		break;
	case tools_base::TOOLS_DM:
		tools = new dm_tools;
		break;
	case tools_base::TOOLS_LEVEL:
		tools = new level_tools;
		break;
	case tools_base::TOOLS_OGG:
		tools = new ogg_tools;
		break;
	case tools_base::TOOLS_DDS:
		tools = new dds_tools;
		break;
	case tools_base::TOOLS_DB:
		tools = new db_unpacker;
		break;
	case tools_base::TOOLS_FOLDER:
		tools = new db_packer;
		break;
	case tools_base::TOOLS_FANCY:
		tools = new fancy_tools;
		break;
	case tools_base::TOOLS_XRDEMO:
		tools = new xrdemo_tools;
		break;
	}
	if (tools == 0) {
		msg("locked");
		return 0;
	}

	clock_t start = clock();
	tools->process(cl);
	msg("total time: %.3lfs", (clock() - start) / 1.0 / CLOCKS_PER_SEC);

	delete tools;
	return 0;
}